

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O1

iter * __thiscall riffcpp::Chunk::iterator::operator++(iterator *this)

{
  streampos *psVar1;
  uint uVar2;
  impl *piVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __mbstate_t _Var6;
  undefined4 uVar7;
  int iVar8;
  anon_union_4_2_91654ee9_for___value aVar9;
  uint32_t in_EAX;
  impl *piVar10;
  undefined4 *puVar11;
  long lVar12;
  Chunk chunk;
  Chunk local_28;
  
  local_28.pimpl._0_4_ = in_EAX;
  piVar10 = (impl *)operator_new(0x48);
  (piVar10->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (piVar10->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar10->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (piVar10->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (piVar10->m_pos)._M_off = 0;
  (piVar10->m_pos)._M_state.__count = 0;
  (piVar10->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (piVar10->m_limit)._M_off = 0;
  (piVar10->m_limit)._M_state.__count = 0;
  (piVar10->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  piVar10->m_id = (_Type)0x0;
  piVar10->m_size = 0;
  piVar3 = this->pimpl;
  (piVar10->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (piVar3->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar10->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(piVar3->m_stream).
              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  piVar3 = this->pimpl;
  uVar7 = *(undefined4 *)((long)&(piVar3->m_pos)._M_off + 4);
  iVar8 = (piVar3->m_pos)._M_state.__count;
  aVar9 = (piVar3->m_pos)._M_state.__value;
  *(int *)&(piVar10->m_pos)._M_off = (int)(piVar3->m_pos)._M_off;
  *(undefined4 *)((long)&(piVar10->m_pos)._M_off + 4) = uVar7;
  (piVar10->m_pos)._M_state.__count = iVar8;
  (piVar10->m_pos)._M_state.__value = aVar9;
  peVar4 = (piVar10->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (piVar10->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  std::istream::seekg(peVar4,(piVar10->m_pos)._M_off,(piVar10->m_pos)._M_state);
  std::istream::read((char *)peVar4,(long)&local_28);
  *(uint32_t *)(piVar10->m_id)._M_elems = (uint32_t)local_28.pimpl;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  peVar4 = (piVar10->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (piVar10->m_stream).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  std::istream::seekg(peVar4,(piVar10->m_pos)._M_off + 4,(piVar10->m_pos)._M_state);
  std::istream::read((char *)peVar4,(long)&local_28);
  piVar10->m_size = (uint32_t)local_28.pimpl;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  uVar2 = piVar10->m_size;
  lVar12 = (piVar10->m_pos)._M_off + (ulong)uVar2;
  piVar3 = this->pimpl;
  if (lVar12 <= (piVar3->m_limit)._M_off) {
    _Var6 = (piVar10->m_pos)._M_state;
    (piVar10->m_limit)._M_off = lVar12;
    (piVar10->m_limit)._M_state = _Var6;
    psVar1 = &piVar3->m_pos;
    psVar1->_M_off = psVar1->_M_off + (ulong)(uVar2 + (uVar2 & 1) + 8);
    local_28.pimpl = piVar10;
    ~Chunk(&local_28);
    return this;
  }
  puVar11 = (undefined4 *)__cxa_allocate_exception(0x10);
  *puVar11 = 2;
  *(char **)(puVar11 + 2) = "Chunk size outside of range";
  __cxa_throw(puVar11,&Error::typeinfo,0);
}

Assistant:

iter &iter::operator++() {
  auto im = new riffcpp::Chunk::impl();
  im->m_stream = pimpl->m_stream;
  im->m_pos = pimpl->m_pos;

  im->m_id = read_id(im->m_stream, im->m_pos);
  im->m_size = read_size(im->m_stream, im->m_pos);

  auto limit = im->m_pos + std::streamoff{im->m_size};

  if (limit > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
  im->m_limit = limit;

  riffcpp::Chunk chunk{im};
  std::uint32_t sz = chunk.size();
  std::streamoff offs{sz + sz % 2 + 8};

  pimpl->m_pos += offs;
  return *this;
}